

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

void Curl_freeset(Curl_easy *data)

{
  undefined1 *puVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    (*Curl_cfree)((data->set).str[lVar3]);
    (data->set).str[lVar3] = (char *)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x4f);
  lVar3 = 0;
  do {
    (*Curl_cfree)((data->set).blobs[lVar3]);
    (data->set).blobs[lVar3] = (curl_blob *)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  uVar2 = *(uint *)&(data->state).field_0x6d0;
  if ((uVar2 >> 0x12 & 1) != 0) {
    (*Curl_cfree)((data->state).referer);
    uVar2 = *(uint *)&(data->state).field_0x6d0 & 0xfffbffff;
    *(uint *)&(data->state).field_0x6d0 = uVar2;
  }
  (data->state).referer = (char *)0x0;
  if ((uVar2 >> 0x11 & 1) != 0) {
    (*Curl_cfree)((data->state).url);
    puVar1 = &(data->state).field_0x6d2;
    *puVar1 = *puVar1 & 0xfd;
  }
  (data->state).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  enum dupblob j;

  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  for(j = (enum dupblob)0; j < BLOB_LAST; j++) {
    Curl_safefree(data->set.blobs[j]);
  }

  if(data->state.referer_alloc) {
    Curl_safefree(data->state.referer);
    data->state.referer_alloc = FALSE;
  }
  data->state.referer = NULL;
  if(data->state.url_alloc) {
    Curl_safefree(data->state.url);
    data->state.url_alloc = FALSE;
  }
  data->state.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}